

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

void __thiscall SQSharedState::~SQSharedState(SQSharedState *this)

{
  SQUnsignedInteger *pSVar1;
  size_type sVar2;
  SQCollectable_conflict *pSVar3;
  SQCollectable_conflict *pSVar4;
  
  if (this->_releasehook != (SQRELEASEHOOK)0x0) {
    (*this->_releasehook)(this->_foreignptr,0);
    this->_releasehook = (SQRELEASEHOOK)0x0;
  }
  SQObjectPtr::Null(&this->_constructorstr);
  (*(((this->_registry).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_consts).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  (*(((this->_metamethodsmap).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  SQObjectPtr::Null(&this->_registry);
  SQObjectPtr::Null(&this->_consts);
  SQObjectPtr::Null(&this->_metamethodsmap);
  while( true ) {
    sVar2 = this->_systemstrings->_size;
    if (sVar2 == 0) break;
    SQObjectPtr::Null(this->_systemstrings->_vals + (sVar2 - 1));
    sqvector<SQObjectPtr,_unsigned_int>::pop_back(this->_systemstrings);
  }
  (*(((this->_root_vm).super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
    super_SQRefCounted._vptr_SQRefCounted[5])();
  SQObjectPtr::Null(&this->_root_vm);
  SQObjectPtr::Null(&this->_table_default_delegate);
  SQObjectPtr::Null(&this->_array_default_delegate);
  SQObjectPtr::Null(&this->_string_default_delegate);
  SQObjectPtr::Null(&this->_number_default_delegate);
  SQObjectPtr::Null(&this->_closure_default_delegate);
  SQObjectPtr::Null(&this->_generator_default_delegate);
  SQObjectPtr::Null(&this->_thread_default_delegate);
  SQObjectPtr::Null(&this->_class_default_delegate);
  SQObjectPtr::Null(&this->_instance_default_delegate);
  SQObjectPtr::Null(&this->_weakref_default_delegate);
  SQObjectPtr::Null(&this->_userdata_default_delegate);
  RefTable::Finalize(&this->_refs_table);
  pSVar3 = this->_gc_chain;
  if (pSVar3 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    while (pSVar4 = pSVar3, pSVar4 != (SQCollectable_conflict *)0x0) {
      (*(pSVar4->super_SQRefCounted)._vptr_SQRefCounted[5])(pSVar4);
      pSVar3 = pSVar4->_gc_next;
      if (pSVar3 != (SQCollectable_conflict *)0x0) {
        pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      pSVar1 = &(pSVar4->super_SQRefCounted)._uiRef;
      *pSVar1 = *pSVar1 - 1;
      if (*pSVar1 == 0) {
        (*(pSVar4->super_SQRefCounted)._vptr_SQRefCounted[2])(pSVar4);
      }
    }
  }
  while (pSVar3 = this->_gc_chain, pSVar3 != (SQCollectable_conflict *)0x0) {
    pSVar1 = &(pSVar3->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
    (*(pSVar3->super_SQRefCounted)._vptr_SQRefCounted[2])();
  }
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector(this->_types);
  sq_vm_free(this->_alloc_ctx,this->_types,0x18);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector(this->_systemstrings);
  sq_vm_free(this->_alloc_ctx,this->_systemstrings,0x18);
  sqvector<SQObjectPtr,_unsigned_int>::~sqvector(this->_metamethodnames);
  sq_vm_free(this->_alloc_ctx,this->_metamethodnames,0x18);
  SQStringTable::~SQStringTable(this->_stringtable);
  sq_vm_free(this->_alloc_ctx,this->_stringtable,0x20);
  if (this->_scratchpad != (SQChar *)0x0) {
    sq_vm_free(this->_alloc_ctx,this->_scratchpad,this->_scratchpadsize);
  }
  SQObjectPtr::~SQObjectPtr(&this->_userdata_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_weakref_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_instance_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_class_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_thread_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_closure_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_generator_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_number_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_string_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_array_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_table_default_delegate);
  SQObjectPtr::~SQObjectPtr(&this->_root_vm);
  SQObjectPtr::~SQObjectPtr(&this->_constructorstr);
  SQObjectPtr::~SQObjectPtr(&this->_consts);
  SQObjectPtr::~SQObjectPtr(&this->_registry);
  RefTable::~RefTable(&this->_refs_table);
  SQObjectPtr::~SQObjectPtr(&this->_metamethodsmap);
  return;
}

Assistant:

SQSharedState::~SQSharedState()
{
    if(_releasehook) { _releasehook(_foreignptr,0); _releasehook = NULL; }
    _constructorstr.Null();
    _table(_registry)->Finalize();
    _table(_consts)->Finalize();
    _table(_metamethodsmap)->Finalize();
    _registry.Null();
    _consts.Null();
    _metamethodsmap.Null();
    while(!_systemstrings->empty()) {
        _systemstrings->back().Null();
        _systemstrings->pop_back();
    }
    _thread(_root_vm)->Finalize();
    _root_vm.Null();
    _table_default_delegate.Null();
    _array_default_delegate.Null();
    _string_default_delegate.Null();
    _number_default_delegate.Null();
    _closure_default_delegate.Null();
    _generator_default_delegate.Null();
    _thread_default_delegate.Null();
    _class_default_delegate.Null();
    _instance_default_delegate.Null();
    _weakref_default_delegate.Null();
    _userdata_default_delegate.Null();
    _refs_table.Finalize();
#ifndef NO_GARBAGE_COLLECTOR
    SQCollectable *t = _gc_chain;
    SQCollectable *nx = NULL;
    if(t) {
        t->_uiRef++;
        while(t) {
            t->Finalize();
            nx = t->_gc_next;
            if(nx) nx->_uiRef++;
            if(--t->_uiRef == 0)
                t->Release();
            t = nx;
        }
    }
    assert(_gc_chain==NULL); //just to proove a theory
    while(_gc_chain){
        _gc_chain->_uiRef++;
        _gc_chain->Release();
    }
#endif

    sq_delete(_alloc_ctx, _types, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _systemstrings, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _metamethodnames, SQObjectPtrVec);
    sq_delete(_alloc_ctx, _stringtable,SQStringTable);
    if(_scratchpad)SQ_FREE(_alloc_ctx,_scratchpad,_scratchpadsize);
}